

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O3

void __thiscall
Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints
          (ComponentMap *this,Solver *generator,SccGraph *dep,uint32 scc,SharedContext *comp)

{
  uint *puVar1;
  pointer pBVar2;
  uint uVar3;
  ulong uVar4;
  ClauseCreator *pCVar5;
  uint *puVar6;
  pointer pMVar7;
  pointer pMVar8;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  uint *puVar12;
  ClauseCreator cc;
  ClauseCreator dc;
  Memcpy<Clasp::Literal> local_b0;
  Mapping *local_a8;
  pointer local_a0;
  SccGraph *local_98;
  Solver *local_90;
  pointer local_88;
  ClauseCreator local_80;
  undefined1 local_60 [8];
  iterator local_58;
  size_type local_50;
  undefined8 local_48;
  pointer local_40;
  uint *local_38;
  
  local_98 = dep;
  ClauseCreator::ClauseCreator(&local_80,*(comp->solvers_).ebo_.buf);
  local_80.flags_._1_1_ = local_80.flags_._1_1_ | 1;
  ClauseCreator::ClauseCreator((ClauseCreator *)local_60,*(comp->solvers_).ebo_.buf);
  pMVar8 = (this->mapping).ebo_.buf;
  uVar4 = (ulong)this->numAtoms;
  pMVar7 = pMVar8 + uVar4;
  uVar3 = (this->mapping).ebo_.size;
  if (this->numAtoms != uVar3) {
    local_40 = pMVar8 + uVar3;
    local_a8 = pMVar7;
    local_90 = generator;
    do {
      pBVar2 = (local_98->bodies_).ebo_.buf;
      uVar3 = pBVar2[pMVar7->node].super_Node.lit.rep_;
      local_a0 = pMVar7;
      if ((byte)(*(byte *)((long)(generator->assign_).assign_.ebo_.buf + (ulong)(uVar3 & 0xfffffffc)
                          ) & 3) != (byte)(((uVar3 & 2) == 0) + 1U)) {
        pBVar2 = pBVar2 + pMVar7->node;
        if (((pBVar2->super_Node).field_0x7 & 0x10) != 0) {
          Potassco::fail(-2,
                         "void Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints(const Solver &, const SccGraph &, uint32, SharedContext &)"
                         ,0x201,"!B.extended()",
                         "Extended bodies not supported - use \'--trans-ext=weight\'",0);
        }
        puVar6 = (pBVar2->super_Node).adj_;
        local_38 = (pBVar2->super_Node).sep_;
        local_88 = pBVar2;
        if (puVar6 != local_38) {
          do {
            if ((ulong)*puVar6 == 0) {
              if ((*(uint *)&(local_98->atoms_).ebo_.buf[puVar6[1]].super_Node.field_0x4 & 0xfffffff
                  ) == scc) goto LAB_00133583;
              do {
                puVar12 = puVar6 + 1;
                puVar11 = puVar6 + 1;
                puVar6 = puVar12;
              } while (*puVar11 != 0);
            }
            else if ((*(uint *)&(local_98->atoms_).ebo_.buf[*puVar6].super_Node.field_0x4 &
                     0xfffffff) == scc) {
LAB_00133583:
              pCVar5 = ClauseCreator::start(&local_80,Static);
              local_b0.first_._0_4_ =
                   (*(uint *)&local_a0->field_0x4 >> 0x1d & 2) + *(uint *)&local_a0->field_0x4 * 4;
              bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                        (&pCVar5->literals_,(Literal *)&local_b0);
              if ((*(uint *)&(local_88->super_Node).field_0x4 & 0xfffffff) == scc) {
                puVar12 = (local_88->super_Node).sep_;
                uVar3 = *puVar12;
                while (uVar3 != 0xffffffff) {
                  pMVar7 = (this->mapping).ebo_.buf;
                  uVar4 = (ulong)this->numAtoms;
                  if (uVar4 != 0) {
                    do {
                      uVar9 = uVar4 >> 1;
                      uVar10 = ~uVar9 + uVar4;
                      uVar4 = uVar9;
                      if (pMVar7[uVar9].node < uVar3) {
                        pMVar7 = pMVar7 + uVar9 + 1;
                        uVar4 = uVar10;
                      }
                    } while (0 < (long)uVar4);
                  }
                  local_b0.first_._0_4_ = *(int *)&pMVar7->field_0x4 << 2;
                  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                            (&local_80.literals_,(Literal *)&local_b0);
                  puVar11 = puVar12 + 1;
                  puVar12 = puVar12 + 1;
                  uVar3 = *puVar11;
                }
              }
              if (*puVar6 == 0) {
                puVar12 = puVar6 + 1;
                uVar3 = puVar6[1];
                puVar6 = puVar12;
                while (uVar3 != 0) {
                  ClauseCreator::start((ClauseCreator *)local_60,Static);
                  local_60 = (undefined1  [8])local_80.solver_;
                  local_50 = 0;
                  local_b0.first_ = local_80.literals_.ebo_.buf;
                  bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
                  insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Literal>>
                            ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)&local_58,
                             local_58,local_80.literals_.ebo_.size,&local_b0);
                  local_48._5_1_ = local_80.flags_._1_1_;
                  local_48._0_5_ = local_80._24_5_;
                  local_48._6_2_ = local_80.flags_._2_2_;
                  pMVar7 = (this->mapping).ebo_.buf;
                  uVar4 = (ulong)this->numAtoms;
                  if (uVar4 != 0) {
                    do {
                      uVar9 = uVar4 >> 1;
                      uVar10 = ~uVar9 + uVar4;
                      uVar4 = uVar9;
                      if (pMVar7[uVar9].node < *puVar6) {
                        pMVar7 = pMVar7 + uVar9 + 1;
                        uVar4 = uVar10;
                      }
                    } while (0 < (long)uVar4);
                  }
                  local_b0.first_._0_4_ = *(int *)&pMVar7->field_0x4 * 4 + 2;
                  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                             &local_58,(Literal *)&local_b0);
                  uVar3 = *puVar12;
                  puVar11 = puVar12;
                  while (uVar3 != 0) {
                    if (uVar3 != *puVar6) {
                      pMVar7 = (this->mapping).ebo_.buf;
                      uVar4 = (ulong)this->numAtoms;
                      if (uVar4 != 0) {
                        do {
                          uVar9 = uVar4 >> 1;
                          uVar10 = ~uVar9 + uVar4;
                          uVar4 = uVar9;
                          if (pMVar7[uVar9].node < uVar3) {
                            pMVar7 = pMVar7 + uVar9 + 1;
                            uVar4 = uVar10;
                          }
                        } while (0 < (long)uVar4);
                      }
                      local_b0.first_._0_4_ = *(int *)&pMVar7->field_0x4 * 4 + 4;
                      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                                 &local_58,(Literal *)&local_b0);
                    }
                    puVar1 = puVar11 + 1;
                    puVar11 = puVar11 + 1;
                    uVar3 = *puVar1;
                  }
                  ClauseCreator::end((ClauseCreator *)local_60,0x14);
                  uVar3 = puVar6[1];
                  puVar6 = puVar6 + 1;
                }
              }
              else {
                pMVar7 = (this->mapping).ebo_.buf;
                uVar4 = (ulong)this->numAtoms;
                if (uVar4 != 0) {
                  do {
                    uVar9 = uVar4 >> 1;
                    uVar10 = ~uVar9 + uVar4;
                    uVar4 = uVar9;
                    if (pMVar7[uVar9].node < *puVar6) {
                      pMVar7 = pMVar7 + uVar9 + 1;
                      uVar4 = uVar10;
                    }
                  } while (0 < (long)uVar4);
                }
                local_b0.first_._0_4_ = *(int *)&pMVar7->field_0x4 * 4 + 2;
                bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                          (&local_80.literals_,(Literal *)&local_b0);
                ClauseCreator::end(&local_80,0x14);
              }
            }
            puVar6 = puVar6 + 1;
          } while (puVar6 != local_38);
        }
        generator = local_90;
        if (*(uint *)&local_a0->field_0x4 < 0x40000000) {
          *local_a8 = *local_a0;
          local_a8 = local_a8 + 1;
        }
      }
      pMVar7 = local_a0 + 1;
    } while (pMVar7 != local_40);
    pMVar8 = (this->mapping).ebo_.buf;
    uVar4 = (ulong)(this->mapping).ebo_.size;
    pMVar7 = local_a8;
  }
  (this->mapping).ebo_.size = (int)uVar4 - (int)((long)pMVar8 + (uVar4 * 8 - (long)pMVar7) >> 3);
  if (local_58 != (iterator)0x0) {
    operator_delete(local_58);
  }
  if (local_80.literals_.ebo_.buf != (pointer)0x0) {
    operator_delete(local_80.literals_.ebo_.buf);
  }
  return;
}

Assistant:

void PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints(const Solver& generator, const SccGraph& dep, uint32 scc, SharedContext& comp) {
	ClauseCreator cc(comp.master());
	cc.addDefaultFlags(ClauseCreator::clause_force_simplify);
	ClauseCreator dc(comp.master());
	MapIt j = mapping.begin() + numAtoms;
	for (MapRange r = bodies(); r.first != r.second; ++r.first) {
		const BodyNode& B = dep.getBody(r.first->node);
		if (generator.isFalse(B.lit)) { continue; }
		POTASSCO_REQUIRE(!B.extended(), "Extended bodies not supported - use '--trans-ext=weight'");
		for (const NodeId* hIt = B.heads_begin(), *hEnd = B.heads_end(); hIt != hEnd; ++hIt) {
			uint32 hScc = *hIt ? dep.getAtom(*hIt).scc : dep.getAtom(hIt[1]).scc;
			if (hScc != scc) {
				// the head is not relevant to this non-hcf - skip it
				if (!*hIt) { do { ++hIt; } while (*hIt); }
				continue;
			}
			// [fb(B) v ~up(a) V hp(o) for all o != a in B.disHead V up(b) for each b in B+ ^ C]
			cc.start().add(r.first->fb());
			if (B.scc == scc) { // add subgoals from same scc
				for (const NodeId* aIt = B.preds(); *aIt != idMax; ++aIt) {
					MapIt_c atMapped = findAtom(*aIt);
					cc.add(atMapped->up());
				}
			}
			if (*hIt) { // normal head
				MapIt_c atMapped = findAtom(*hIt);
				assert(atMapped != atoms().second);
				cc.add(~atMapped->up());
				cc.end();
			}
			else { // disjunctive head
				const NodeId* dHead = ++hIt;
				for (; *hIt; ++hIt) {
					dc.start();
					dc = cc;
					MapIt_c atMapped = findAtom(*hIt);
					dc.add(~atMapped->up());
					for (const NodeId* other = dHead; *other; ++other) {
						if (*other != *hIt) {
							assert(dep.getAtom(*other).scc == scc);
							atMapped = findAtom(*other);
							dc.add(atMapped->hp());
						}
					}
					dc.end();
				}
			}
		}
		if (!r.first->eq()) { *j++ = *r.first; }
	}
	mapping.erase(j, mapping.end());
}